

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

MPP_RET vp8d_parser_parse(void *ctx,HalDecTask *in_task)

{
  vpBoolCoder_t *pvVar1;
  RK_S8 *pRVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined2 uVar10;
  byte bVar11;
  undefined2 uVar12;
  VP8DParserContext_t *p;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  RK_S8 RVar19;
  RK_U8 RVar20;
  uint uVar21;
  RK_U32 RVar22;
  vpColorSpace_e vVar23;
  RK_S32 RVar24;
  RK_U32 RVar25;
  MPP_RET MVar26;
  long lVar27;
  RK_U8 (*paRVar28) [19];
  RK_U8 (*paaaRVar29) [8] [3] [11];
  char *pcVar30;
  uint3 *puVar31;
  VP8Frame *pVVar32;
  FILE *__s;
  byte bVar33;
  RK_U8 (*paRVar34) [19];
  RK_U8 (*paRVar35) [17];
  RK_U8 (*paaaRVar36) [8] [3] [11];
  byte bVar37;
  byte bVar38;
  long lVar39;
  undefined4 *puVar40;
  RK_U32 RVar41;
  DXVA_PicParams_VP8 *pDVar42;
  long lVar43;
  RK_U8 (*paRVar44) [11];
  ulong uVar45;
  MppFrame s;
  RK_U8 (*paaaRVar46) [8] [3] [11];
  int iVar47;
  ulong uVar48;
  undefined8 uVar49;
  RK_U8 (*paRVar50) [11];
  RK_U8 (*paaaRVar51) [8] [3] [11];
  int iVar52;
  byte *pbVar53;
  long lVar54;
  uint uVar55;
  RK_U8 *pRVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  long lStackY_170;
  char name [256];
  undefined5 uVar5;
  undefined4 uVar7;
  undefined3 uVar9;
  
  p = *ctx;
  if ((vp8d_debug & 1) == 0) {
    pbVar53 = p->bitstream_sw_buf;
    RVar41 = p->stream_size;
  }
  else {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x508,
               "vp8d_parser_parse");
    pbVar53 = p->bitstream_sw_buf;
    RVar41 = p->stream_size;
    if ((vp8d_debug & 1) != 0) {
      _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x4a3,
                 "decoder_frame_header");
    }
  }
  bVar11 = *pbVar53;
  uVar21 = bVar11 & 1;
  p->keyFrame = uVar21 ^ 1;
  bVar33 = *pbVar53 >> 1 & 7;
  p->vpVersion = bVar33;
  p->showFrame = 1;
  if ((bVar11 & 1) == 0) {
    if (p->needKeyFrame == 0) {
      p->needKeyFrame = 1;
    }
LAB_001a8885:
    if (p->decMode == 1) {
      p->offsetToDctParts = (uint)pbVar53[2] << 0xc | (uint)pbVar53[1] << 4 | (uint)(*pbVar53 >> 4);
      uVar55 = (bVar33 == 0) + 3;
    }
    else {
      uVar55 = 3;
      p->offsetToDctParts = (uint)pbVar53[2] << 0xb | (uint)(*pbVar53 >> 5) + (uint)pbVar53[1] * 8;
      p->showFrame = *pbVar53 >> 4 & 1;
    }
    p->frameTagSize = uVar55;
    if ((char)uVar21 == '\0') {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2f1,
                   "vp8hwdResetProbs");
      }
      for (lVar27 = 0; lVar27 != 0x40; lVar27 = lVar27 + 4) {
        *(undefined4 *)((long)p->vp7ScanOrder + lVar27) =
             *(undefined4 *)((long)&vp7_header_parser_Vp7DefaultScan + lVar27);
      }
      (p->entropy).probLuma16x16PredMode[0] = 'p';
      (p->entropy).probLuma16x16PredMode[1] = 'V';
      (p->entropy).probLuma16x16PredMode[2] = 0x8c;
      (p->entropy).probLuma16x16PredMode[3] = '%';
      (p->entropy).probChromaPredMode[0] = 0xa2;
      (p->entropy).probChromaPredMode[1] = 'e';
      (p->entropy).probChromaPredMode[2] = 0xcc;
      for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
        p->mbRefLfDelta[lVar27] = 0;
      }
      for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
        p->mbModeLfDelta[lVar27] = 0;
      }
      paRVar28 = (p->entropy).probMvContext;
      if (p->decMode == 2) {
        paRVar34 = Vp8DefaultMvProbs;
        for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
          for (lVar43 = 0; lVar43 != 0x13; lVar43 = lVar43 + 1) {
            (*paRVar28)[lVar43] = (*paRVar34)[lVar43];
          }
          paRVar28 = paRVar28 + 1;
          paRVar34 = paRVar34 + 1;
        }
      }
      else {
        paRVar35 = Vp7DefaultMvProbs;
        for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
          for (lVar43 = 0; lVar43 != 0x11; lVar43 = lVar43 + 1) {
            (*paRVar28)[lVar43] = (*paRVar35)[lVar43];
          }
          paRVar28 = paRVar28 + 1;
          paRVar35 = paRVar35 + 1;
        }
      }
      paaaRVar29 = (p->entropy).probCoeffs;
      paaaRVar36 = DefaultCoeffProbs;
      for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
        paRVar44 = (RK_U8 (*) [11])paaaRVar36;
        paaaRVar46 = paaaRVar29;
        for (lVar43 = 0; lVar43 != 8; lVar43 = lVar43 + 1) {
          paRVar50 = paRVar44;
          paaaRVar51 = paaaRVar46;
          for (lVar39 = 0; lVar39 != 3; lVar39 = lVar39 + 1) {
            for (lVar54 = 0; lVar54 != 0xb; lVar54 = lVar54 + 1) {
              (*paaaRVar51)[0][0][lVar54] = (*(RK_U8 (*) [3] [11])*paRVar50)[0][lVar54];
            }
            paaaRVar51 = (RK_U8 (*) [8] [3] [11])((*paaaRVar51)[0] + 1);
            paRVar50 = paRVar50 + 1;
          }
          paaaRVar46 = (RK_U8 (*) [8] [3] [11])(*paaaRVar46 + 1);
          paRVar44 = paRVar44 + 3;
        }
        paaaRVar29 = paaaRVar29 + 1;
        paaaRVar36 = (RK_U8 (*) [8] [3] [11])((long)paaaRVar36 + 0x108);
      }
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x319,
                   "vp8hwdResetProbs");
      }
    }
    pbVar53 = pbVar53 + uVar55;
    RVar41 = RVar41 - uVar55;
    if (p->decMode == 2) {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x337,
                   "vp8_header_parser");
      }
      if (p->keyFrame != 0) {
        MVar26 = MPP_ERR_PROTOL;
        if (((uint)pbVar53[2] | (uint)pbVar53[1] << 8 | (uint)*pbVar53 << 0x10) != 0x9d012a)
        goto LAB_001a9666;
        bVar11 = pbVar53[4];
        uVar21 = (bVar11 & 0x3f) << 8 | (uint)pbVar53[3];
        p->width = uVar21;
        RVar22 = ScaleDimension(uVar21,(uint)(bVar11 >> 6));
        p->scaledWidth = RVar22;
        bVar11 = pbVar53[6];
        uVar21 = (bVar11 & 0x3f) << 8 | (uint)pbVar53[5];
        p->height = uVar21;
        RVar22 = ScaleDimension(uVar21,(uint)(bVar11 >> 6));
        p->scaledHeight = RVar22;
        pbVar53 = pbVar53 + 7;
        RVar41 = RVar41 - 7;
      }
      pvVar1 = &p->bitstr;
      vp8hwdBoolStart(pvVar1,pbVar53,RVar41);
      if (p->keyFrame != 0) {
        vVar23 = vp8hwdDecodeBool128(pvVar1);
        p->colorSpace = vVar23;
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->clamping = RVar41;
      }
      RVar41 = vp8hwdDecodeBool128(pvVar1);
      p->segmentationEnabled = RVar41;
      p->segmentationMapUpdate = 0;
      if (RVar41 == 0) {
LAB_001a8eeb:
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->loopFilterType = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,6);
        p->loopFilterLevel = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,3);
        p->loopFilterSharpness = RVar41;
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->modeRefLfEnabled = RVar41;
        if ((RVar41 != 0) && (RVar41 = vp8hwdDecodeBool128(pvVar1), RVar41 != 0)) {
          for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
            RVar41 = vp8hwdDecodeBool128(pvVar1);
            if (RVar41 != 0) {
              RVar41 = vp8hwdReadBits(pvVar1,6);
              p->mbRefLfDelta[lVar27] = RVar41;
              RVar41 = vp8hwdDecodeBool128(pvVar1);
              if (RVar41 != 0) {
                p->mbRefLfDelta[lVar27] = -p->mbRefLfDelta[lVar27];
              }
            }
          }
          for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
            RVar41 = vp8hwdDecodeBool128(pvVar1);
            if (RVar41 != 0) {
              RVar41 = vp8hwdReadBits(pvVar1,6);
              p->mbModeLfDelta[lVar27] = RVar41;
              RVar41 = vp8hwdDecodeBool128(pvVar1);
              if (RVar41 != 0) {
                p->mbModeLfDelta[lVar27] = -p->mbModeLfDelta[lVar27];
              }
            }
          }
        }
        if ((p->bitstr).strmError != 0) {
          _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
          uVar48 = 0x38a;
          goto LAB_001a9626;
        }
        RVar41 = vp8hwdReadBits(pvVar1,2);
        p->nbrDctPartitions = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,7);
        p->qpYAc = (RK_S8)RVar41;
        RVar24 = DecodeQuantizerDelta(pvVar1);
        p->qpYDc = (RK_S8)RVar24;
        RVar24 = DecodeQuantizerDelta(pvVar1);
        p->qpY2Dc = (RK_S8)RVar24;
        RVar24 = DecodeQuantizerDelta(pvVar1);
        p->qpY2Ac = (RK_S8)RVar24;
        RVar24 = DecodeQuantizerDelta(pvVar1);
        p->qpChDc = (RK_S8)RVar24;
        RVar24 = DecodeQuantizerDelta(pvVar1);
        p->qpChAc = (RK_S8)RVar24;
        if (p->keyFrame == 0) {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refreshGolden = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refreshAlternate = RVar41;
          RVar25 = 0;
          RVar22 = 0;
          if (p->refreshGolden == 0) {
            RVar22 = vp8hwdReadBits(pvVar1,2);
            RVar41 = p->refreshAlternate;
          }
          p->copyBufferToGolden = RVar22;
          if (RVar41 == 0) {
            RVar25 = vp8hwdReadBits(pvVar1,2);
          }
          p->copyBufferToAlternate = RVar25;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refFrameSignBias[0] = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refFrameSignBias[1] = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refreshEntropyProbs = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refreshLast = RVar41;
          RVar41 = p->refreshEntropyProbs;
        }
        else {
          p->refreshGolden = 1;
          p->refreshAlternate = 1;
          p->copyBufferToGolden = 0;
          p->copyBufferToAlternate = 0;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->refreshEntropyProbs = RVar41;
          p->refFrameSignBias[0] = 0;
          p->refFrameSignBias[1] = 0;
          p->refreshLast = 1;
        }
        if (RVar41 == 0) {
          memcpy(&p->entropyLast,&p->entropy,0x44d);
          uVar49 = *(undefined8 *)(p->vp7ScanOrder + 2);
          uVar13 = *(undefined8 *)(p->vp7ScanOrder + 4);
          uVar14 = *(undefined8 *)(p->vp7ScanOrder + 6);
          uVar15 = *(undefined8 *)(p->vp7ScanOrder + 8);
          uVar16 = *(undefined8 *)(p->vp7ScanOrder + 10);
          uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
          uVar18 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
          *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
          *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar49;
          *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar13;
          *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar14;
          *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar15;
          *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar16;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar17;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar18;
        }
        vp8hwdDecodeCoeffUpdate(p);
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->coeffSkipMode = (RK_U8)RVar41;
        if (p->keyFrame == 0) {
          if (RVar41 != 0) {
            RVar41 = vp8hwdReadBits(pvVar1,8);
            p->probMbSkipFalse = RVar41;
          }
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probIntra = RVar41;
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probRefLast = RVar41;
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probRefGolden = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
              RVar41 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probLuma16x16PredMode[lVar27] = (RK_U8)RVar41;
            }
          }
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            for (lVar27 = 0; lVar27 != 3; lVar27 = lVar27 + 1) {
              RVar41 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probChromaPredMode[lVar27] = (RK_U8)RVar41;
            }
          }
          paRVar28 = (p->entropy).probMvContext;
          paRVar34 = MvUpdateProbs;
          for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
            for (lVar43 = 0; lVar43 != 0x13; lVar43 = lVar43 + 1) {
              RVar41 = vp8hwdDecodeBool(pvVar1,(uint)(*paRVar34)[lVar43]);
              if (RVar41 != 0) {
                RVar41 = vp8hwdReadBits(pvVar1,7);
                RVar20 = (char)RVar41 * '\x02';
                if (RVar41 == 0) {
                  RVar20 = '\x01';
                }
                (*paRVar28)[lVar43] = RVar20;
              }
            }
            paRVar28 = paRVar28 + 1;
            paRVar34 = paRVar34 + 1;
          }
        }
        else if (RVar41 != 0) {
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probMbSkipFalse = RVar41;
        }
        if ((p->bitstr).strmError != 0) {
          _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
          uVar48 = 999;
          goto LAB_001a9626;
        }
        if ((vp8d_debug & 1) != 0) {
          MVar26 = MPP_OK;
          uVar48 = 0x3ea;
          goto LAB_001a9635;
        }
        pRVar56 = p->bitstream_sw_buf;
        goto LAB_001a9716;
      }
      RVar41 = vp8hwdDecodeBool128(pvVar1);
      p->segmentationMapUpdate = RVar41;
      RVar41 = vp8hwdDecodeBool128(pvVar1);
      if (RVar41 != 0) {
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->segmentFeatureMode = RVar41;
        p->segmentQp[0] = 0;
        p->segmentQp[1] = 0;
        p->segmentQp[2] = 0;
        p->segmentQp[3] = 0;
        p->segmentLoopfilter[0] = 0;
        p->segmentLoopfilter[1] = 0;
        p->segmentLoopfilter[2] = 0;
        p->segmentLoopfilter[3] = 0;
        for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            RVar41 = vp8hwdReadBits(pvVar1,7);
            p->segmentQp[lVar27] = RVar41;
            RVar41 = vp8hwdDecodeBool128(pvVar1);
            if (RVar41 != 0) {
              p->segmentQp[lVar27] = -p->segmentQp[lVar27];
            }
          }
        }
        for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            RVar41 = vp8hwdReadBits(pvVar1,6);
            p->segmentLoopfilter[lVar27] = RVar41;
            RVar41 = vp8hwdDecodeBool128(pvVar1);
            if (RVar41 != 0) {
              p->segmentLoopfilter[lVar27] = -p->segmentLoopfilter[lVar27];
            }
          }
        }
      }
      if (p->segmentationMapUpdate != 0) {
        p->probSegment[0] = 0xff;
        p->probSegment[1] = 0xff;
        p->probSegment[2] = 0xff;
        for (lVar27 = 0; lVar27 != 3; lVar27 = lVar27 + 1) {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            RVar41 = vp8hwdReadBits(pvVar1,8);
            p->probSegment[lVar27] = RVar41;
          }
        }
      }
      if ((p->bitstr).strmError == 0) goto LAB_001a8eeb;
      _mpp_log_l(2,"vp8d_parser","paser header stream no enough","vp8_header_parser");
      uVar48 = 0x36e;
LAB_001a9626:
      MVar26 = MPP_ERR_STREAM;
      if ((vp8d_debug & 1) != 0) {
LAB_001a9635:
        pcVar30 = "vp8_header_parser";
        goto LAB_001a963c;
      }
    }
    else {
      if ((vp8d_debug & 1) != 0) {
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x3f4,
                   "vp7_header_parser");
      }
      pvVar1 = &p->bitstr;
      vp8hwdBoolStart(pvVar1,pbVar53,RVar41);
      if (p->keyFrame != 0) {
        RVar41 = vp8hwdReadBits(pvVar1,0xc);
        p->width = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,0xc);
        p->height = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,2);
        RVar41 = ScaleDimension(p->width,RVar41);
        p->scaledWidth = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,2);
        RVar41 = ScaleDimension(p->height,RVar41);
        p->scaledHeight = RVar41;
      }
      iVar52 = 4;
      puVar40 = (undefined4 *)&DAT_0027aee0;
      if (p->vpVersion == '\0') {
        puVar40 = &DAT_0027aed0;
      }
      lVar27 = 0;
LAB_001a8d4a:
      if ((int)lVar27 != 4) {
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        if (RVar41 == 0) goto code_r0x001a8d5c;
        vp8hwdReadBits(pvVar1,8);
        iVar47 = 3;
        while (bVar57 = iVar47 != 0, iVar47 = iVar47 + -1, bVar57) {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            vp8hwdReadBits(pvVar1,8);
          }
        }
        RVar24 = puVar40[lVar27];
        if (RVar24 != 0) {
          while (bVar57 = iVar52 != 0, iVar52 = iVar52 + -1, bVar57) {
            RVar41 = vp8hwdDecodeBool128(pvVar1);
            if (RVar41 != 0) {
              vp8hwdReadBits(pvVar1,RVar24);
            }
          }
        }
        uVar48 = 0x415;
        MVar26 = MPP_ERR_PROTOL;
        goto LAB_001a92d8;
      }
      p->nbrDctPartitions = 0;
      RVar41 = vp8hwdReadBits(pvVar1,7);
      p->qpYAc = (RK_S8)RVar41;
      RVar41 = vp8hwdReadBits(pvVar1,1);
      if (RVar41 == 0) {
        RVar19 = p->qpYAc;
      }
      else {
        RVar41 = vp8hwdReadBits(pvVar1,7);
        RVar19 = (RK_S8)RVar41;
      }
      p->qpYDc = RVar19;
      RVar41 = vp8hwdReadBits(pvVar1,1);
      if (RVar41 == 0) {
        RVar19 = p->qpYAc;
      }
      else {
        RVar41 = vp8hwdReadBits(pvVar1,7);
        RVar19 = (RK_S8)RVar41;
      }
      p->qpY2Dc = RVar19;
      RVar41 = vp8hwdReadBits(pvVar1,1);
      if (RVar41 == 0) {
        RVar19 = p->qpYAc;
      }
      else {
        RVar41 = vp8hwdReadBits(pvVar1,7);
        RVar19 = (RK_S8)RVar41;
      }
      p->qpY2Ac = RVar19;
      RVar41 = vp8hwdReadBits(pvVar1,1);
      if (RVar41 == 0) {
        RVar19 = p->qpYAc;
      }
      else {
        RVar41 = vp8hwdReadBits(pvVar1,7);
        RVar19 = (RK_S8)RVar41;
      }
      p->qpChDc = RVar19;
      RVar22 = 1;
      RVar41 = vp8hwdReadBits(pvVar1,1);
      if (RVar41 == 0) {
        RVar19 = p->qpYAc;
      }
      else {
        RVar41 = vp8hwdReadBits(pvVar1,7);
        RVar19 = (RK_S8)RVar41;
      }
      p->qpChAc = RVar19;
      if (p->keyFrame == 0) {
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->refreshGolden = RVar41;
        if (p->vpVersion == '\0') {
          p->refreshLast = 1;
          p->refreshEntropyProbs = 1;
          goto LAB_001a92a9;
        }
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->refreshEntropyProbs = RVar41;
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        p->refreshLast = RVar41;
        if (p->refreshEntropyProbs == 0) {
          memcpy(&p->entropyLast,&p->entropy,0x44d);
          uVar49 = *(undefined8 *)(p->vp7ScanOrder + 2);
          uVar13 = *(undefined8 *)(p->vp7ScanOrder + 4);
          uVar14 = *(undefined8 *)(p->vp7ScanOrder + 6);
          uVar15 = *(undefined8 *)(p->vp7ScanOrder + 8);
          uVar16 = *(undefined8 *)(p->vp7ScanOrder + 10);
          uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
          uVar18 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
          *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
          *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar49;
          *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar13;
          *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar14;
          *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar15;
          *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar16;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar17;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar18;
        }
        if (RVar41 != 0) goto LAB_001a92a9;
LAB_001a92ea:
        if (p->vpVersion == '\0') {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->loopFilterType = RVar41;
        }
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        if (RVar41 != 0) {
          p->vp7ScanOrder[0] = 0;
          for (lVar27 = 0; lVar27 != 0xf; lVar27 = lVar27 + 1) {
            RVar41 = vp8hwdReadBits(pvVar1,4);
            p->vp7ScanOrder[lVar27 + 1] = (&vp7_header_parser_Vp7DefaultScan)[RVar41];
          }
        }
        if (p->vpVersion != '\0') {
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          p->loopFilterType = RVar41;
        }
        RVar41 = vp8hwdReadBits(pvVar1,6);
        p->loopFilterLevel = RVar41;
        RVar41 = vp8hwdReadBits(pvVar1,3);
        p->loopFilterSharpness = RVar41;
        vp8hwdDecodeCoeffUpdate(p);
        if (p->keyFrame == 0) {
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probIntra = RVar41;
          RVar41 = vp8hwdReadBits(pvVar1,8);
          p->probRefLast = RVar41;
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
              RVar41 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probLuma16x16PredMode[lVar27] = (RK_U8)RVar41;
            }
          }
          RVar41 = vp8hwdDecodeBool128(pvVar1);
          if (RVar41 != 0) {
            for (lVar27 = 0; lVar27 != 3; lVar27 = lVar27 + 1) {
              RVar41 = vp8hwdReadBits(pvVar1,8);
              (p->entropy).probChromaPredMode[lVar27] = (RK_U8)RVar41;
            }
          }
          paRVar28 = (p->entropy).probMvContext;
          paRVar34 = MvUpdateProbs;
          for (lVar27 = 0; lVar27 != 2; lVar27 = lVar27 + 1) {
            for (lVar43 = 0; lVar43 != 0x11; lVar43 = lVar43 + 1) {
              RVar41 = vp8hwdDecodeBool(pvVar1,(uint)(*paRVar34)[lVar43]);
              if (RVar41 != 0) {
                RVar41 = vp8hwdReadBits(pvVar1,7);
                RVar20 = (char)RVar41 * '\x02';
                if (RVar41 == 0) {
                  RVar20 = '\x01';
                }
                (*paRVar28)[lVar43] = RVar20;
              }
            }
            paRVar28 = paRVar28 + 1;
            paRVar34 = paRVar34 + 1;
          }
        }
        bVar57 = (p->bitstr).strmError == 0;
        MVar26 = MPP_ERR_PROTOL;
        if (bVar57) {
          MVar26 = MPP_OK;
        }
        if ((vp8d_debug & 1) != 0) {
          uVar48 = (ulong)((uint)bVar57 * 4 + 0x477);
          goto LAB_001a93c5;
        }
      }
      else {
        p->refreshGolden = 1;
        p->refreshAlternate = 1;
        p->copyBufferToGolden = 0;
        p->copyBufferToAlternate = 0;
        if (p->vpVersion != '\0') {
          RVar22 = vp8hwdDecodeBool128(pvVar1);
        }
        p->refreshEntropyProbs = RVar22;
        p->refFrameSignBias[0] = 0;
        p->refFrameSignBias[1] = 0;
        p->refreshLast = 1;
        if (RVar22 == 0) {
          memcpy(&p->entropyLast,&p->entropy,0x44d);
          uVar49 = *(undefined8 *)(p->vp7ScanOrder + 2);
          uVar13 = *(undefined8 *)(p->vp7ScanOrder + 4);
          uVar14 = *(undefined8 *)(p->vp7ScanOrder + 6);
          uVar15 = *(undefined8 *)(p->vp7ScanOrder + 8);
          uVar16 = *(undefined8 *)(p->vp7ScanOrder + 10);
          uVar17 = *(undefined8 *)(p->vp7ScanOrder + 0xc);
          uVar18 = *(undefined8 *)(p->vp7ScanOrder + 0xe);
          *(undefined8 *)p->vp7PrevScanOrder = *(undefined8 *)p->vp7ScanOrder;
          *(undefined8 *)(p->vp7PrevScanOrder + 2) = uVar49;
          *(undefined8 *)(p->vp7PrevScanOrder + 4) = uVar13;
          *(undefined8 *)(p->vp7PrevScanOrder + 6) = uVar14;
          *(undefined8 *)(p->vp7PrevScanOrder + 8) = uVar15;
          *(undefined8 *)(p->vp7PrevScanOrder + 10) = uVar16;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xc) = uVar17;
          *(undefined8 *)(p->vp7PrevScanOrder + 0xe) = uVar18;
        }
LAB_001a92a9:
        RVar41 = vp8hwdDecodeBool128(pvVar1);
        if (RVar41 == 0) goto LAB_001a92ea;
        vp8hwdReadBits(pvVar1,8);
        vp8hwdReadBits(pvVar1,8);
        uVar48 = 0x448;
        MVar26 = MPP_ERR_STREAM;
LAB_001a92d8:
        if ((vp8d_debug & 1) == 0) goto LAB_001a9666;
LAB_001a93c5:
        pcVar30 = "vp7_header_parser";
LAB_001a963c:
        _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar48,pcVar30);
      }
      if (MVar26 == MPP_OK) {
        pRVar56 = p->bitstream_sw_buf;
        if ((vp8d_debug & 1) != 0) {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x487,
                     "vp8hwdSetPartitionOffsets");
        }
LAB_001a9716:
        iVar47 = 0;
        iVar52 = 0;
        if ((p->decMode == 2) && (iVar52 = 7, p->keyFrame == 0)) {
          iVar52 = 0;
        }
        uVar21 = p->frameTagSize;
        RVar41 = p->offsetToDctParts;
        bVar11 = (byte)p->nbrDctPartitions;
        puVar31 = (uint3 *)(pRVar56 + (ulong)(iVar52 + RVar41) + (ulong)uVar21);
        uVar45 = (ulong)(uint)~(-1 << (bVar11 & 0x1f));
        for (uVar48 = 0; RVar22 = iVar47 + uVar21 + RVar41 + (3 << (bVar11 & 0x1f)) + -3,
            uVar45 != uVar48; uVar48 = uVar48 + 1) {
          p->dctPartitionOffsets[uVar48] = RVar22;
          iVar47 = (uint)*puVar31 + iVar47;
          puVar31 = (uint3 *)((long)puVar31 + 3);
        }
        p->dctPartitionOffsets[uVar45] = RVar22;
        if ((vp8d_debug & 1) != 0) {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x25f,
                     "vp8d_alloc_frame");
        }
        pVVar32 = p->frame_out;
        if (pVVar32 == (VP8Frame *)0x0) {
          pVVar32 = (VP8Frame *)mpp_osal_calloc("vp8d_alloc_frame",0x10);
          p->frame_out = pVVar32;
          uVar48 = 0xfffffc12;
          if (pVVar32 != (VP8Frame *)0x0) {
            s = pVVar32->f;
            if (s == (MppFrame)0x0) {
              mpp_frame_init((MppFrame *)pVVar32);
              pVVar32 = p->frame_out;
              s = pVVar32->f;
              if (s == (MppFrame)0x0) {
                pcVar30 = "alloc vp8 mpp frame fail";
                goto LAB_001a9fca;
              }
            }
            pVVar32->slot_index = 0xff;
            pVVar32->invisible = p->showFrame == 0;
            goto LAB_001a9848;
          }
          pcVar30 = "alloc vp8 frame fail";
LAB_001a9fca:
          _mpp_log_l(2,"vp8d_parser",pcVar30,(char *)0x0);
          MVar26 = (MPP_RET)uVar48;
          _mpp_log_l(2,"vp8d_parser","vp8d_alloc_frame err ret %d",(char *)0x0,uVar48);
          uVar49 = 0x517;
          goto LAB_001a9689;
        }
        if (pVVar32->slot_index == 0xff) {
          s = pVVar32->f;
LAB_001a9848:
          mpp_frame_set_width(s,p->width);
          mpp_frame_set_height(p->frame_out->f,p->height);
          mpp_frame_set_hor_stride(p->frame_out->f,p->width);
          mpp_frame_set_ver_stride(p->frame_out->f,p->height);
          mpp_frame_set_errinfo(p->frame_out->f,0);
          mpp_frame_set_pts(p->frame_out->f,p->pts);
          MVar26 = mpp_buf_slot_get_unused(p->frame_slots,&p->frame_out->slot_index);
          if (MVar26 != MPP_OK) {
            uVar48 = (ulong)(uint)MVar26;
            pcVar30 = "vp8 buf_slot_get_unused get fail";
            goto LAB_001a9fca;
          }
          mpp_buf_slot_set_prop(p->frame_slots,p->frame_out->slot_index,SLOT_FRAME,p->frame_out->f);
          mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_CODEC_USE);
          mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_HAL_OUTPUT);
          mpp_frame_set_mode(p->frame_out->f,0);
          if (p->showFrame != 0) {
            mpp_buf_slot_set_flag(p->frame_slots,p->frame_out->slot_index,SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(p->frame_slots,p->frame_out->slot_index,QUEUE_DISPLAY);
          }
          pRVar2 = &p->frame_out->ref_count;
          *pRVar2 = *pRVar2 + '\x01';
        }
        if ((vp8d_debug & 1) == 0) {
          pDVar42 = p->dxva_ctx;
        }
        else {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x290,
                     "vp8d_alloc_frame");
          pDVar42 = p->dxva_ctx;
          if ((vp8d_debug & 1) != 0) {
            _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x1ed,
                       "vp8d_convert_to_syntx");
          }
        }
        uVar21 = (p->bitstr).pos * 8 - (p->bitstr).count;
        bVar57 = p->keyFrame == 0;
        iVar52 = 0x38;
        if (bVar57) {
          iVar52 = 0;
        }
        lVar27 = 0;
        if (p->decMode != 2) {
          iVar52 = 0;
        }
        uVar55 = uVar21 + (uint)(p->frameTagSize == 4) * 8 + iVar52 + 8;
        pDVar42->stream_start_offset = uVar55 >> 3 & 0xfffffff8;
        pDVar42->stream_start_bit = uVar21 & 7 | uVar55 & 0x38;
        bVar11 = (pDVar42->field_4).wFrameTagFlags;
        bVar33 = (pDVar42->stVP8Segments).field_0.wSegmentFlags;
        (pDVar42->field_4).wFrameTagFlags = bVar11 & 0xfe | bVar57;
        bVar37 = (byte)p->segmentationEnabled & 1;
        (pDVar42->stVP8Segments).field_0.wSegmentFlags = bVar33 & 0xfe | bVar37;
        bVar38 = (char)p->segmentationMapUpdate * '\x02' & 2;
        (pDVar42->stVP8Segments).field_0.wSegmentFlags = bVar33 & 0xfc | bVar37 | bVar38;
        pDVar42->mode_ref_lf_delta_enabled = (RK_U8)p->modeRefLfEnabled;
        pDVar42->mb_no_coeff_skip = p->coeffSkipMode;
        RVar41 = p->height;
        pDVar42->width = p->width;
        pDVar42->height = RVar41;
        pDVar42->decMode = p->decMode;
        pDVar42->filter_type = (RK_U8)p->loopFilterType;
        pDVar42->sharpness = (RK_U8)p->loopFilterSharpness;
        pDVar42->filter_level = (RK_U8)p->loopFilterLevel;
        (pDVar42->stVP8Segments).field_0.wSegmentFlags =
             bVar33 & 0xf8 | bVar37 | bVar38 | ((byte)p->segmentFeatureMode & 1) << 2;
        (pDVar42->field_4).wFrameTagFlags = bVar11 & 0xf0 | bVar57 | p->vpVersion * '\x02' & 0xe;
        pDVar42->bool_value = (uint)*(byte *)((long)&(p->bitstr).value + 3);
        pDVar42->bool_range = (uint)(byte)(p->bitstr).range;
        pDVar42->frameTagSize = p->frameTagSize;
        pDVar42->streamEndPos = (p->bitstr).streamEndPos;
        pDVar42->log2_nbr_of_dct_partitions = (RK_U8)p->nbrDctPartitions;
        pDVar42->offsetToDctParts = p->offsetToDctParts;
        uVar48._0_1_ = p->qpYAc;
        uVar48._1_1_ = p->qpYDc;
        uVar3 = p->qpY2Ac;
        uVar4 = p->qpY2Dc;
        uVar6 = p->qpChAc;
        uVar8 = p->qpChDc;
        uVar10 = *(undefined2 *)&p->field_0xf6;
        uVar9 = CONCAT21(uVar10,uVar8);
        uVar7 = CONCAT31(uVar9,uVar6);
        uVar5 = CONCAT41(uVar7,uVar4);
        uVar48._2_6_ = CONCAT51(uVar5,uVar3);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar48;
        auVar58 = psllw(auVar58,8);
        uVar21 = auVar58._0_4_ | CONCAT22((ushort)uVar48._2_6_ >> 8,(ushort)uVar48 >> 8);
        pDVar42->y1dc_delta_q = (char)uVar21;
        pDVar42->y1ac_delta_q = (char)(uVar21 >> 8);
        pDVar42->y2dc_delta_q = (char)(uVar21 >> 0x10);
        pDVar42->y2ac_delta_q = (char)(uVar21 >> 0x18);
        pDVar42->uvac_delta_q = p->qpChAc;
        pDVar42->uvdc_delta_q = p->qpChDc;
        pDVar42->probe_skip_false = (RK_U8)p->probMbSkipFalse;
        pDVar42->prob_intra = (RK_U8)p->probIntra;
        pDVar42->prob_last = (RK_U8)p->probRefLast;
        pDVar42->prob_golden = (RK_U8)p->probRefGolden;
        memcpy(pDVar42->vp8_coef_update_probs,(p->entropy).probCoeffs,0x420);
        uVar49 = *(undefined8 *)((p->entropy).probMvContext[0] + 8);
        uVar13 = *(undefined8 *)((p->entropy).probMvContext[0] + 0x10);
        uVar14 = *(undefined8 *)((p->entropy).probMvContext[1] + 5);
        *(undefined8 *)pDVar42->vp8_mv_update_probs[0] =
             *(undefined8 *)(p->entropy).probMvContext[0];
        *(undefined8 *)(pDVar42->vp8_mv_update_probs[0] + 8) = uVar49;
        *(undefined8 *)(pDVar42->vp8_mv_update_probs[0] + 0x10) = uVar13;
        *(undefined8 *)(pDVar42->vp8_mv_update_probs[1] + 5) = uVar14;
        *(undefined8 *)(pDVar42->vp8_mv_update_probs[1] + 0xb) =
             *(undefined8 *)((p->entropy).probMvContext[1] + 0xb);
        for (; lVar27 != 3; lVar27 = lVar27 + 1) {
          pDVar42->intra_chroma_prob[lVar27] = (p->entropy).probChromaPredMode[lVar27];
          (pDVar42->stVP8Segments).mb_segment_tree_probs[lVar27] = (RK_U8)p->probSegment[lVar27];
        }
        pDVar42->ref_frame_sign_bias_golden = (RK_U8)p->refFrameSignBias[0];
        pDVar42->ref_frame_sign_bias_altref = (RK_U8)p->refFrameSignBias[1];
        for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
          (pDVar42->stVP8Segments).segment_feature_data[0][lVar27] = (RK_S8)p->segmentQp[lVar27];
          pDVar42->ref_lf_deltas[lVar27] = (RK_S8)p->mbRefLfDelta[lVar27];
          pDVar42->mode_lf_deltas[lVar27] = (RK_S8)p->mbModeLfDelta[lVar27];
          (pDVar42->stVP8Segments).segment_feature_data[1][lVar27] =
               (RK_S8)p->segmentLoopfilter[lVar27];
          pDVar42->intra_16x16_prob[lVar27] = (p->entropy).probLuma16x16PredMode[lVar27];
        }
        (p->dxva_ctx->CurrPic).field_0.bPicEntry =
             (p->dxva_ctx->CurrPic).field_0.bPicEntry & 0x80 | (byte)p->frame_out->slot_index & 0x7f
        ;
        in_task->refer[0xc] = -1;
        in_task->refer[0xd] = -1;
        in_task->refer[0xe] = -1;
        in_task->refer[0xf] = -1;
        in_task->refer[8] = -1;
        in_task->refer[9] = -1;
        in_task->refer[10] = -1;
        in_task->refer[0xb] = -1;
        in_task->refer[0x10] = -1;
        in_task->refer[4] = -1;
        in_task->refer[5] = -1;
        in_task->refer[6] = -1;
        in_task->refer[7] = -1;
        in_task->refer[0] = -1;
        in_task->refer[1] = -1;
        in_task->refer[2] = -1;
        in_task->refer[3] = -1;
        if (p->frame_ref == (VP8Frame *)0x0) {
          (pDVar42->lst_fb_idx).field_0.bPicEntry = (pDVar42->lst_fb_idx).field_0.bPicEntry | 0x7f;
        }
        else {
          (pDVar42->lst_fb_idx).field_0.bPicEntry =
               (pDVar42->lst_fb_idx).field_0.bPicEntry & 0x80 |
               (byte)p->frame_ref->slot_index & 0x7f;
          mpp_buf_slot_set_flag(p->frame_slots,p->frame_ref->slot_index,SLOT_HAL_INPUT);
          in_task->refer[0] = p->frame_ref->slot_index;
        }
        if (p->frame_golden == (VP8Frame *)0x0) {
          (pDVar42->gld_fb_idx).field_0.bPicEntry = (pDVar42->gld_fb_idx).field_0.bPicEntry | 0x7f;
        }
        else {
          (pDVar42->gld_fb_idx).field_0.bPicEntry =
               (pDVar42->gld_fb_idx).field_0.bPicEntry & 0x80 |
               (byte)p->frame_golden->slot_index & 0x7f;
          mpp_buf_slot_set_flag(p->frame_slots,p->frame_golden->slot_index,SLOT_HAL_INPUT);
          in_task->refer[1] = p->frame_golden->slot_index;
        }
        if (p->frame_alternate == (VP8Frame *)0x0) {
          (pDVar42->alt_fb_idx).field_0.bPicEntry = (pDVar42->alt_fb_idx).field_0.bPicEntry | 0x7f;
        }
        else {
          (pDVar42->alt_fb_idx).field_0.bPicEntry =
               (pDVar42->alt_fb_idx).field_0.bPicEntry & 0x80 |
               (byte)p->frame_alternate->slot_index & 0x7f;
          mpp_buf_slot_set_flag(p->frame_slots,p->frame_alternate->slot_index,SLOT_HAL_INPUT);
          in_task->refer[2] = p->frame_alternate->slot_index;
        }
        uVar49 = *(undefined8 *)p->dctPartitionOffsets;
        uVar13 = *(undefined8 *)(p->dctPartitionOffsets + 2);
        uVar14 = *(undefined8 *)(p->dctPartitionOffsets + 6);
        *(undefined8 *)(pDVar42->dctPartitionOffsets + 4) =
             *(undefined8 *)(p->dctPartitionOffsets + 4);
        *(undefined8 *)(pDVar42->dctPartitionOffsets + 6) = uVar14;
        *(undefined8 *)pDVar42->dctPartitionOffsets = uVar49;
        *(undefined8 *)(pDVar42->dctPartitionOffsets + 2) = uVar13;
        if ((vp8d_debug & 1) != 0) {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",599,
                     "vp8d_convert_to_syntx");
        }
        if (p->refreshEntropyProbs == 0) {
          memcpy(&p->entropy,&p->entropyLast,0x44d);
          uVar49 = *(undefined8 *)(p->vp7PrevScanOrder + 2);
          uVar13 = *(undefined8 *)(p->vp7PrevScanOrder + 4);
          uVar14 = *(undefined8 *)(p->vp7PrevScanOrder + 6);
          uVar15 = *(undefined8 *)(p->vp7PrevScanOrder + 8);
          uVar16 = *(undefined8 *)(p->vp7PrevScanOrder + 10);
          uVar17 = *(undefined8 *)(p->vp7PrevScanOrder + 0xc);
          uVar18 = *(undefined8 *)(p->vp7PrevScanOrder + 0xe);
          *(undefined8 *)p->vp7ScanOrder = *(undefined8 *)p->vp7PrevScanOrder;
          *(undefined8 *)(p->vp7ScanOrder + 2) = uVar49;
          *(undefined8 *)(p->vp7ScanOrder + 4) = uVar13;
          *(undefined8 *)(p->vp7ScanOrder + 6) = uVar14;
          *(undefined8 *)(p->vp7ScanOrder + 8) = uVar15;
          *(undefined8 *)(p->vp7ScanOrder + 10) = uVar16;
          *(undefined8 *)(p->vp7ScanOrder + 0xc) = uVar17;
          *(undefined8 *)(p->vp7ScanOrder + 0xe) = uVar18;
        }
        (in_task->syntax).data = p->dxva_ctx;
        (in_task->syntax).number = 1;
        in_task->output = p->frame_out->slot_index;
        in_task->valid = 1;
        if (p->eos != 0) {
          (in_task->flags).val = (in_task->flags).val & 0xfffffffffffffffe | (ulong)(p->eos & 1);
        }
        if ((vp8d_debug & 1) != 0) {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",0x2a5,
                     "vp8d_ref_update");
        }
        if (p->decMode != 3) {
          if (p->copyBufferToAlternate == 2) {
            pVVar32 = p->frame_alternate;
            lVar27 = 0x28;
LAB_001aa00f:
            if (pVVar32 != (VP8Frame *)0x0) {
              vp8d_unref_frame(p,pVVar32);
            }
            pVVar32 = *(VP8Frame **)((long)&p->dxva_ctx + lVar27);
            p->frame_alternate = pVVar32;
            vp8d_ref_frame(pVVar32);
          }
          else if (p->copyBufferToAlternate == 1) {
            lVar27 = 0x20;
            pVVar32 = p->frame_alternate;
            goto LAB_001aa00f;
          }
          if (p->copyBufferToGolden == 2) {
            pVVar32 = p->frame_golden;
            lStackY_170 = 0x30;
LAB_001aa050:
            if (pVVar32 != (VP8Frame *)0x0) {
              vp8d_unref_frame(p,pVVar32);
            }
            pVVar32 = *(VP8Frame **)((long)&p->dxva_ctx + lStackY_170);
            p->frame_golden = pVVar32;
            vp8d_ref_frame(pVVar32);
          }
          else if (p->copyBufferToGolden == 1) {
            pVVar32 = p->frame_golden;
            lStackY_170 = 0x20;
            goto LAB_001aa050;
          }
          if (p->refreshGolden != 0) {
            if (p->frame_golden != (VP8Frame *)0x0) {
              vp8d_unref_frame(p,p->frame_golden);
            }
            p->frame_golden = p->frame_out;
            vp8d_ref_frame(p->frame_out);
          }
          if (p->refreshAlternate != 0) {
            if (p->frame_alternate != (VP8Frame *)0x0) {
              vp8d_unref_frame(p,p->frame_alternate);
            }
            p->frame_alternate = p->frame_out;
            vp8d_ref_frame(p->frame_out);
          }
          if (p->refreshLast != 0) {
            if (p->frame_ref != (VP8Frame *)0x0) {
              vp8d_unref_frame(p,p->frame_ref);
            }
            p->frame_ref = p->frame_out;
            vp8d_ref_frame(p->frame_out);
          }
          vp8d_unref_frame(p,p->frame_out);
          p->frame_out = (VP8Frame *)0x0;
        }
        if ((vp8d_debug & 1) != 0) {
          _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x2e5,
                     "vp8d_ref_update");
        }
        if ((vp8d_debug >> 0xc & 1) != 0) {
          __s = (FILE *)p->stream_fp;
          if (__s == (FILE *)0x0) {
            uVar21 = getpid();
            sprintf(name,"/data/video/mpp_dec_vp8_%d.bin",(ulong)uVar21);
            __s = fopen(name,"wb");
            p->stream_fp = (FILE *)__s;
            if (__s == (FILE *)0x0) goto LAB_001aa25b;
          }
          if (p->ivf_header_flag == 0) {
            builtin_strncpy(name,"DKIF",5);
            name[5] = '\0';
            name[6] = ' ';
            name[7] = '\0';
            uVar12 = (undefined2)p->width;
            name[0xc] = (char)uVar12;
            name[0xd] = (char)((ushort)uVar12 >> 8);
            name[8] = 'V';
            name[9] = 'P';
            name[10] = '8';
            name[0xb] = '0';
            name[0xe] = (char)p->height;
            name[0xf] = (char)(p->height >> 8);
            name[0x10] = '\x1e';
            name[0x11] = '\0';
            name[0x12] = '\0';
            name[0x13] = '\0';
            name[0x14] = '\x01';
            name[0x15] = '\0';
            name[0x16] = '\0';
            name[0x17] = '\0';
            name[0x18] = -1;
            name[0x19] = -1;
            name[0x1a] = -1;
            name[0x1b] = -1;
            name[0x1c] = '\0';
            name[0x1d] = '\0';
            name[0x1e] = '\0';
            name[0x1f] = '\0';
            fwrite(name,0x20,1,__s);
            p->ivf_header_flag = 1;
            __s = (FILE *)p->stream_fp;
          }
          RVar41 = p->frame_cnt;
          name[4] = (char)RVar41;
          name._0_4_ = p->stream_size;
          name[5] = (char)(RVar41 >> 8);
          name[6] = (char)(RVar41 >> 0x10);
          name[7] = (char)(RVar41 >> 0x18);
          name._8_8_ = name._8_8_ & 0xffffffff00000000;
          fwrite(name,0xc,1,__s);
          fwrite(p->bitstream_sw_buf,1,(ulong)p->stream_size,(FILE *)p->stream_fp);
          fflush((FILE *)p->stream_fp);
        }
LAB_001aa25b:
        p->frame_cnt = p->frame_cnt + 1;
        uVar49 = 0x53f;
        MVar26 = MPP_OK;
        goto LAB_001a9689;
      }
    }
  }
  else {
    if (p->needKeyFrame != 0) goto LAB_001a8885;
    MVar26 = MPP_NOK;
    _mpp_log_l(2,"vp8d_parser","no found key frame",(char *)0x0);
  }
LAB_001a9666:
  _mpp_log_l(2,"vp8d_parser","decoder_frame_header err ret %d",(char *)0x0,(ulong)(uint)MVar26);
  uVar49 = 0x50e;
LAB_001a9689:
  if ((vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",uVar49,
               "vp8d_parser_parse");
  }
  return MVar26;
code_r0x001a8d5c:
  lVar27 = lVar27 + 1;
  goto LAB_001a8d4a;
}

Assistant:

MPP_RET vp8d_parser_parse(void *ctx, HalDecTask *in_task)
{
    MPP_RET ret = MPP_OK;
    VP8DContext *c = (VP8DContext *)ctx;
    VP8DParserContext_t *p = (VP8DParserContext_t *)c->parse_ctx;
    FUN_T("FUN_IN");

    ret = decoder_frame_header(p, p->bitstream_sw_buf, p->stream_size);

    if (MPP_OK != ret) {
        mpp_err("decoder_frame_header err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8hwdSetPartitionOffsets(p, p->bitstream_sw_buf, p->stream_size);

    ret = vp8d_alloc_frame(p);
    if (MPP_OK != ret) {
        mpp_err("vp8d_alloc_frame err ret %d", ret);
        FUN_T("FUN_OUT");
        return ret;
    }

    vp8d_convert_to_syntx(p, in_task);
    /* Rollback entropy probabilities if refresh is not set */
    if (p->refreshEntropyProbs == 0) {
        memcpy((void*)&p->entropy, (void*)&p->entropyLast,
               (unsigned long)sizeof(vp8EntropyProbs_t));
        memcpy((void*)p->vp7ScanOrder, (void*)p->vp7PrevScanOrder,
               (unsigned long)sizeof(p->vp7ScanOrder));
    }
    in_task->syntax.data = (void *)p->dxva_ctx;
    in_task->syntax.number = 1;
    in_task->output = p->frame_out->slot_index;
    in_task->valid = 1;
    if (p->eos) {
        in_task->flags.eos = p->eos;
    }
    vp8d_ref_update(p);

    if (vp8d_debug & VP8D_DBG_DUMP_STREAM) {
        if (!p->stream_fp) {
            char name[256];

            sprintf(name, "/data/video/mpp_dec_vp8_%d.bin", getpid());
            p->stream_fp = fopen(name, "wb");
        }
        if (p->stream_fp) {
            if (!p->ivf_header_flag) {
                write_ivf_header(p, p->stream_fp);
                p->ivf_header_flag = 1;
            }
            write_ivf_frame(p->stream_fp, p->stream_size, p->frame_cnt);
            fwrite(p->bitstream_sw_buf, 1, p->stream_size, p->stream_fp);
            fflush(p->stream_fp);
        }
    }
    p->frame_cnt++;

    FUN_T("FUN_OUT");
    return ret;
}